

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O2

pair<int,_double>
alex::fanout_tree::find_best_fanout_bottom_up<int,int,alex::AlexCompare>
          (undefined8 expected_insert_frac,undefined8 values,uint num_keys,long node,
          undefined4 total_keys,
          vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
          *used_fanout_tree_nodes,int max_fanout,undefined4 max_data_node_keys,
          undefined1 approximate_model_computation,undefined1 approximate_cost_computation)

{
  double dVar1;
  pointer pFVar2;
  FTNode *tree_node;
  pointer pFVar3;
  ulong uVar4;
  int fanout_tree_level;
  uint uVar5;
  int fanout;
  int iVar6;
  pair<int,_double> pVar7;
  initializer_list<alex::fanout_tree::FTNode> __l;
  allocator_type local_109;
  double best_cost;
  uint local_fc;
  double local_f8;
  int local_ec;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  fanout_tree;
  double cost;
  vector<double,_std::allocator<double>_> fanout_costs;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> new_level;
  
  fanout_tree.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8 = (double)CONCAT44(local_f8._4_4_,total_keys);
  best_cost = *(double *)(node + 0x20) + 20.0;
  fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  fanout_tree.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fanout_tree.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ec = max_fanout;
  std::vector<double,_std::allocator<double>_>::push_back(&fanout_costs,&best_cost);
  new_level.
  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_level.
  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)best_cost;
  new_level.
  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)((ulong)num_keys << 0x20);
  __l._M_len = 1;
  __l._M_array = (iterator)&new_level;
  std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::vector
            ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)&cost,
             __l,&local_109);
  std::
  vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>
  ::emplace_back<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>
            ((vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>
              *)&fanout_tree,
             (vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)&cost)
  ;
  std::_Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
  ~_Vector_base((_Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                 *)&cost);
  uVar5 = 1;
  iVar6 = 2;
  local_fc = 0;
  do {
    if (local_ec < iVar6) {
LAB_00121d88:
      uVar5 = local_fc;
      pFVar2 = fanout_tree.
               super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)local_fc].
               super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pFVar3 = fanout_tree.
                    super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(int)local_fc].
                    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start; pFVar3 != pFVar2; pFVar3 = pFVar3 + 1
          ) {
        pFVar3->use = true;
      }
      best_cost = merge_nodes_upwards<int,int>
                            (local_fc,best_cost,num_keys,local_f8._0_4_,&fanout_tree);
      collect_used_nodes(&fanout_tree,uVar5,used_fanout_tree_nodes);
      local_f8 = best_cost;
      std::
      vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
      ::~vector(&fanout_tree);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&fanout_costs.super__Vector_base<double,_std::allocator<double>_>);
      pVar7._4_4_ = 0;
      pVar7.first = uVar5;
      pVar7.second = local_f8;
      return pVar7;
    }
    new_level.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    new_level.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    new_level.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cost = compute_level<int,int,alex::AlexCompare>
                     (expected_insert_frac,values,num_keys,node,(ulong)local_f8 & 0xffffffff,
                      &new_level.
                       super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                      ,uVar5,max_data_node_keys,approximate_model_computation,
                      approximate_cost_computation);
    std::vector<double,_std::allocator<double>_>::push_back(&fanout_costs,&cost);
    uVar4 = (long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (((0x10 < uVar4) &&
        (dVar1 = *(double *)
                  ((long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + (uVar4 - 0x10)),
        dVar1 < *(double *)
                 ((long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + (uVar4 - 8)))) &&
       (*(double *)
         ((long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + (uVar4 - 0x18)) < dVar1)) {
      std::_Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
      ~_Vector_base(&new_level.
                     super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                   );
      goto LAB_00121d88;
    }
    if (cost < best_cost) {
      best_cost = cost;
      local_fc = uVar5;
    }
    std::
    vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
    ::push_back(&fanout_tree,
                (value_type *)
                &new_level.
                 super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               );
    std::_Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
    ~_Vector_base(&new_level.
                   super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                 );
    iVar6 = iVar6 * 2;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

std::pair<int, double> find_best_fanout_bottom_up(
    const std::pair<T, P> values[], int num_keys, const AlexNode<T, P>* node,
    int total_keys, std::vector<FTNode>& used_fanout_tree_nodes, int max_fanout,
    int max_data_node_keys, double expected_insert_frac = 0,
    bool approximate_model_computation = true,
    bool approximate_cost_computation = false, Compare key_less = Compare()) {
  // Repeatedly add levels to the fanout tree until the overall cost of each
  // level starts to increase
  int best_level = 0;
  double best_cost = node->cost_ + kNodeLookupsWeight;
  std::vector<double> fanout_costs;
  std::vector<std::vector<FTNode>> fanout_tree;
  fanout_costs.push_back(best_cost);
  fanout_tree.push_back(
      {{0, 0, best_cost, 0, num_keys, false, 0, 0, 0, 0, num_keys}});
  for (int fanout = 2, fanout_tree_level = 1; fanout <= max_fanout;
       fanout *= 2, fanout_tree_level++) {
    std::vector<FTNode> new_level;
    double cost = compute_level<T, P, Compare>(
        values, num_keys, node, total_keys, new_level, fanout_tree_level,
        max_data_node_keys, expected_insert_frac, approximate_model_computation,
        approximate_cost_computation, key_less);
    fanout_costs.push_back(cost);
    if (fanout_costs.size() >= 3 &&
        fanout_costs[fanout_costs.size() - 1] >
            fanout_costs[fanout_costs.size() - 2] &&
        fanout_costs[fanout_costs.size() - 2] >
            fanout_costs[fanout_costs.size() - 3]) {
      break;
    }
    if (cost < best_cost) {
      best_cost = cost;
      best_level = fanout_tree_level;
    }
    fanout_tree.push_back(new_level);
  }
  for (FTNode& tree_node : fanout_tree[best_level]) {
    tree_node.use = true;
  }

  // Merge nodes to improve cost
  best_cost = merge_nodes_upwards<T, P>(best_level, best_cost, num_keys,
                                        total_keys, fanout_tree);

  collect_used_nodes(fanout_tree, best_level, used_fanout_tree_nodes);
  return std::make_pair(best_level, best_cost);
}